

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementPtr xmlGetDtdElementDesc(xmlDtdPtr dtd,xmlChar *name)

{
  xmlChar *local_40;
  xmlChar *prefix;
  xmlChar *localname;
  xmlElementPtr cur;
  xmlElementTablePtr table;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  
  if (((dtd == (xmlDtdPtr)0x0) || (dtd->elements == (void *)0x0)) || (name == (xmlChar *)0x0)) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else {
    cur = (xmlElementPtr)dtd->elements;
    if (cur == (xmlElementPtr)0x0) {
      dtd_local = (xmlDtdPtr)0x0;
    }
    else {
      table = (xmlElementTablePtr)name;
      name_local = (xmlChar *)dtd;
      prefix = xmlSplitQName4(name,&local_40);
      if (prefix == (xmlChar *)0x0) {
        dtd_local = (xmlDtdPtr)0x0;
      }
      else {
        localname = (xmlChar *)xmlHashLookup2((xmlHashTablePtr)cur,prefix,local_40);
        if (local_40 != (xmlChar *)0x0) {
          (*xmlFree)(local_40);
        }
        dtd_local = (xmlDtdPtr)localname;
      }
    }
  }
  return (xmlElementPtr)dtd_local;
}

Assistant:

xmlElementPtr
xmlGetDtdElementDesc(xmlDtdPtr dtd, const xmlChar *name) {
    xmlElementTablePtr table;
    xmlElementPtr cur;
    const xmlChar *localname;
    xmlChar *prefix;

    if ((dtd == NULL) || (dtd->elements == NULL) ||
        (name == NULL))
        return(NULL);

    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL)
	return(NULL);

    localname = xmlSplitQName4(name, &prefix);
    if (localname == NULL)
        return(NULL);
    cur = xmlHashLookup2(table, localname, prefix);
    if (prefix != NULL)
        xmlFree(prefix);
    return(cur);
}